

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_array_lastIndexOf(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue val_00;
  JSValue op2;
  JSValue obj_00;
  JSValue op1;
  JSValue JVar1;
  int iVar2;
  BOOL BVar3;
  JSValueUnion JVar4;
  int in_ECX;
  JSContext *in_RDI;
  JSValue *in_R8;
  JSValue JVar5;
  JSValue JVar6;
  int present;
  int64_t res;
  int64_t n;
  int64_t len;
  JSValue val;
  JSValue obj;
  JSValue v;
  JSContext *in_stack_ffffffffffffff00;
  JSValue in_stack_ffffffffffffff08;
  JSValueUnion pres;
  JSContext *ctx_00;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  int64_t in_stack_ffffffffffffff30;
  JSValueUnion JVar7;
  JSValueUnion JVar8;
  long in_stack_ffffffffffffff40;
  JSStrictEqModeEnum in_stack_ffffffffffffff4c;
  JSContext *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff90;
  int32_t iVar9;
  undefined4 in_stack_ffffffffffffff94;
  JSValueUnion in_stack_ffffffffffffff98;
  int64_t in_stack_ffffffffffffffa0;
  int64_t local_58;
  JSValueUnion local_30;
  int64_t local_28;
  undefined4 uStack_c;
  
  JVar5.tag = in_stack_ffffffffffffffa0;
  JVar5.u.float64 = in_stack_ffffffffffffff98.float64;
  JVar5 = JS_ToObject((JSContext *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                      JVar5);
  pres = JVar5.u;
  ctx_00 = (JSContext *)JVar5.tag;
  JVar6.u._4_4_ = in_stack_ffffffffffffff2c;
  JVar6.u.int32 = in_stack_ffffffffffffff28;
  JVar6.tag = in_stack_ffffffffffffff30;
  iVar2 = js_get_length64(ctx_00,(int64_t *)pres.ptr,JVar6);
  if (iVar2 == 0) {
    JVar7.float64 = -NAN;
    JVar8.float64 = JVar7.float64;
    if (0 < in_stack_ffffffffffffff40) {
      JVar4.ptr = (void *)(in_stack_ffffffffffffff40 + -1);
      if ((1 < in_ECX) &&
         (val_00.tag = in_stack_ffffffffffffff40, val_00.u.ptr = JVar4.ptr,
         iVar2 = JS_ToInt64Clamp((JSContext *)0xffffffffffffffff,
                                 (int64_t *)
                                 CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                                 val_00,JVar5.tag,(int64_t)JVar5.u,
                                 (int64_t)in_stack_ffffffffffffff50), iVar2 != 0))
      goto LAB_001b0907;
      while (JVar8 = JVar7, -1 < (long)JVar4.ptr) {
        obj_00.tag._0_4_ = in_stack_ffffffffffffff70;
        obj_00.u.ptr = in_R8;
        obj_00.tag._4_4_ = in_ECX;
        iVar2 = JS_TryGetPropertyInt64
                          (ctx_00,obj_00,(int64_t)pres,(JSValue *)in_stack_ffffffffffffff50);
        if (iVar2 < 0) goto LAB_001b0907;
        JVar8 = JVar4;
        if (iVar2 != 0) {
          in_stack_ffffffffffffff00 = in_RDI;
          in_stack_ffffffffffffff08 = JS_DupValue(in_RDI,*in_R8);
          op1.tag._0_4_ = in_stack_ffffffffffffff70;
          op1.u.ptr = in_R8;
          op1.tag._4_4_ = in_ECX;
          op2.tag = (int64_t)ctx_00;
          op2.u.float64 = pres.float64;
          JVar8 = JVar4;
          BVar3 = js_strict_eq2(in_stack_ffffffffffffff50,op1,op2,in_stack_ffffffffffffff4c);
          if (BVar3 != 0) break;
        }
        JVar4.float64 = JVar8.float64 + -1;
      }
    }
    JS_FreeValue(in_stack_ffffffffffffff00,in_stack_ffffffffffffff08);
    if (JVar8.ptr == (void *)(long)JVar8.int32) {
      local_30._4_4_ = uStack_c;
      local_30.int32 = JVar8.int32;
      local_28 = 0;
    }
    else {
      JVar6 = __JS_NewFloat64(in_RDI,(double)JVar8.float64);
      local_30 = JVar6.u;
      local_58 = JVar6.tag;
      local_28 = local_58;
    }
    iVar9 = local_30.int32;
    in_stack_ffffffffffffff94 = local_30._4_4_;
  }
  else {
LAB_001b0907:
    JS_FreeValue(in_stack_ffffffffffffff00,in_stack_ffffffffffffff08);
    iVar9 = 0;
    local_28 = 6;
  }
  JVar1.u._4_4_ = in_stack_ffffffffffffff94;
  JVar1.u.int32 = iVar9;
  JVar1.tag = local_28;
  return JVar1;
}

Assistant:

static JSValue js_array_lastIndexOf(JSContext *ctx, JSValueConst this_val,
                                    int argc, JSValueConst *argv)
{
    JSValue obj, val;
    int64_t len, n, res;
    int present;

    obj = JS_ToObject(ctx, this_val);
    if (js_get_length64(ctx, &len, obj))
        goto exception;

    res = -1;
    if (len > 0) {
        n = len - 1;
        if (argc > 1) {
            if (JS_ToInt64Clamp(ctx, &n, argv[1], -1, len - 1, len))
                goto exception;
        }
        /* XXX: should special case fast arrays */
        for (; n >= 0; n--) {
            present = JS_TryGetPropertyInt64(ctx, obj, n, &val);
            if (present < 0)
                goto exception;
            if (present) {
                if (js_strict_eq2(ctx, JS_DupValue(ctx, argv[0]), val, JS_EQ_STRICT)) {
                    res = n;
                    break;
                }
            }
        }
    }
    JS_FreeValue(ctx, obj);
    return JS_NewInt64(ctx, res);

 exception:
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}